

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsequenceFinder.cpp
# Opt level: O3

int __thiscall Saturation::ConsequenceFinder::init(ConsequenceFinder *this,EVP_PKEY_CTX *ctx)

{
  SubscriptionObject *pSVar1;
  void **head;
  long lVar2;
  undefined8 *puVar3;
  SmartPtr<Lib::SubscriptionObject> *pSVar4;
  SmartPtr<Lib::SubscriptionObject> local_38;
  
  this->_sa = (SaturationAlgorithm *)ctx;
  lVar2 = (**(code **)(*(long *)ctx + 0x20))(ctx);
  puVar3 = (undefined8 *)::operator_new(0x28);
  *puVar3 = 0;
  puVar3[1] = 0;
  *puVar3 = &PTR__HandlerStruct_00b3ef90;
  puVar3[2] = this;
  puVar3[3] = onClauseInserted;
  puVar3[4] = 0;
  Lib::BaseEvent::subscribe((BaseEvent *)&local_38,(HandlerStruct *)(lVar2 + 8));
  Lib::SmartPtr<Lib::SubscriptionObject>::operator=(&this->_sdInsertion,&local_38);
  pSVar1 = local_38._obj;
  if (((local_38._obj != (SubscriptionObject *)0x0) &&
      ((SmartPtr<Lib::SubscriptionObject> *)local_38._refCnt !=
       (SmartPtr<Lib::SubscriptionObject> *)0x0)) &&
     ((local_38._refCnt)->_val = (local_38._refCnt)->_val + -1, (local_38._refCnt)->_val == 0)) {
    Lib::SubscriptionObject::~SubscriptionObject(local_38._obj);
    operator_delete(pSVar1,0x10);
    if ((SmartPtr<Lib::SubscriptionObject> *)local_38._refCnt !=
        (SmartPtr<Lib::SubscriptionObject> *)0x0) {
      *(undefined8 *)&(local_38._refCnt)->_val = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_38._refCnt;
    }
  }
  puVar3 = (undefined8 *)::operator_new(0x28);
  *puVar3 = 0;
  puVar3[1] = 0;
  *puVar3 = &PTR__HandlerStruct_00b3ef90;
  puVar3[2] = this;
  puVar3[3] = onClauseRemoved;
  puVar3[4] = 0;
  Lib::BaseEvent::subscribe((BaseEvent *)&local_38,(HandlerStruct *)(lVar2 + 0x10));
  pSVar4 = Lib::SmartPtr<Lib::SubscriptionObject>::operator=(&this->_sdRemoval,&local_38);
  if (((local_38._obj != (SubscriptionObject *)0x0) &&
      (pSVar4 = (SmartPtr<Lib::SubscriptionObject> *)local_38._refCnt,
      (SmartPtr<Lib::SubscriptionObject> *)local_38._refCnt !=
      (SmartPtr<Lib::SubscriptionObject> *)0x0)) &&
     ((local_38._refCnt)->_val = (local_38._refCnt)->_val + -1, (local_38._refCnt)->_val == 0)) {
    Lib::SubscriptionObject::~SubscriptionObject(local_38._obj);
    operator_delete(local_38._obj,0x10);
    pSVar4 = (SmartPtr<Lib::SubscriptionObject> *)local_38._refCnt;
    if ((SmartPtr<Lib::SubscriptionObject> *)local_38._refCnt !=
        (SmartPtr<Lib::SubscriptionObject> *)0x0) {
      *(undefined8 *)&(local_38._refCnt)->_val = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_38._refCnt;
    }
  }
  return (int)pSVar4;
}

Assistant:

void ConsequenceFinder::init(SaturationAlgorithm* sa)
{
  _sa=sa;

  ClauseContainer* cc=_sa->getSimplifyingClauseContainer();
  _sdInsertion = cc->addedEvent.subscribe(this,&ConsequenceFinder::onClauseInserted);
  _sdRemoval = cc->removedEvent.subscribe(this,&ConsequenceFinder::onClauseRemoved);
}